

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O1

void anon_unknown.dwarf_608d4::assert_in_msg(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  initializer_list<int> __l;
  string msg;
  vector<int,_std::allocator<int>_> v;
  string local_c0;
  Assert local_a0;
  vector<int,_std::allocator<int>_> local_90 [4];
  
  local_c0._M_dataplus._M_p = (pointer)0x100000000;
  local_c0._M_string_length = 0x300000002;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_c0;
  std::vector<int,_std::allocator<int>_>::vector(local_90,__l,(allocator_type *)&local_a0);
  local_a0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_a0.m_line = 0x119;
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Extra message","");
  UnitTests::Assert::In<int,std::vector<int,std::allocator<int>>&>(&local_a0,&local_c0,10,local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_a0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_a0.m_line = 0x11a;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"ASSERT_IN should have fired here.","");
  UnitTests::Assert::Fail(&local_a0,&local_c0);
}

Assistant:

TEST(assert_in_msg)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            ASSERT_IN("Extra message", 10, v);
            FAIL("ASSERT_IN should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg = e.what();
            std::string expected =
                "error A1000: Assertion failure : Extra message. Expected container to contain 10, actual contents :\n"
                "\t[0, 1, 2, 3]";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_IN", __FILE__, __LINE__);
            }
        }
    }